

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom3d.c
# Opt level: O0

matrix4 * v3matMul(matrix4 *a,matrix4 *b,matrix4 *c)

{
  int local_2c;
  int local_28;
  int k;
  int j;
  int i;
  matrix4 *c_local;
  matrix4 *b_local;
  matrix4 *a_local;
  
  for (k = 0; k < 4; k = k + 1) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      c->element[k][local_28] = 0.0;
      for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
        c->element[k][local_28] =
             a->element[k][local_2c] * b->element[local_2c][local_28] + c->element[k][local_28];
      }
    }
  }
  return c;
}

Assistant:

matrix4*    v3matMul(matrix4* a, matrix4* b, matrix4* c) {
	int i, j, k;
	for (i=0; i < 4; i++) {
		for (j=0; j < 4; j++) {
			c->element[i][j] = 0.0;
			for (k=0; k < 4; k++) {
				c->element[i][j] +=
					a->element[i][k] * b->element[k][j];
			}
		}
	}
	return(c);
}